

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

void sysbvm_function_recordBindingWithOwnerAndName
               (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_tuple_t owner,
               sysbvm_tuple_t name)

{
  _Bool _Var1;
  
  _Var1 = sysbvm_tuple_isFunction((sysbvm_context_t *)function,function);
  if (_Var1) {
    sysbvm_programEntity_recordBindingWithOwnerAndName(context,function,owner,name);
    if (*(sysbvm_tuple_t *)(function + 0x48) != 0) {
      sysbvm_programEntity_recordBindingWithOwnerAndName
                (context,*(sysbvm_tuple_t *)(function + 0x48),owner,name);
      return;
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_function_recordBindingWithOwnerAndName(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_tuple_t owner, sysbvm_tuple_t name)
{
    (void)context;
    if(!sysbvm_tuple_isFunction(context, function)) return;

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    sysbvm_programEntity_recordBindingWithOwnerAndName(context, function, owner, name);

    // Record the owner also in the definition.
    if(functionObject->definition)
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, functionObject->definition, owner, name);
}